

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

void google::protobuf::StrAppend(string *result,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d)

{
  LogMessage *pLVar1;
  pointer pcVar2;
  char *pcVar3;
  ulong uVar4;
  LogFinisher local_69;
  LogMessage local_68;
  
  pcVar2 = (result->_M_dataplus)._M_p;
  uVar4 = result->_M_string_length;
  if ((ulong)((long)a->piece_data_ - (long)pcVar2) <= uVar4) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,"third_party/protobuf-lite/strutil.cc",0x643);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: (uintptr_t((a).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_69,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
    pcVar2 = (result->_M_dataplus)._M_p;
    uVar4 = result->_M_string_length;
  }
  if ((ulong)((long)b->piece_data_ - (long)pcVar2) <= uVar4) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,"third_party/protobuf-lite/strutil.cc",0x644);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: (uintptr_t((b).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_69,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
    pcVar2 = (result->_M_dataplus)._M_p;
    uVar4 = result->_M_string_length;
  }
  if ((ulong)((long)c->piece_data_ - (long)pcVar2) <= uVar4) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,"third_party/protobuf-lite/strutil.cc",0x645);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: (uintptr_t((c).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_69,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
    pcVar2 = (result->_M_dataplus)._M_p;
    uVar4 = result->_M_string_length;
  }
  if ((ulong)((long)d->piece_data_ - (long)pcVar2) <= uVar4) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,"third_party/protobuf-lite/strutil.cc",0x646);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: (uintptr_t((d).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_69,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
    uVar4 = result->_M_string_length;
  }
  std::__cxx11::string::resize((ulong)result);
  pcVar2 = (result->_M_dataplus)._M_p;
  pcVar3 = Append4(pcVar2 + uVar4,a,b,c,d);
  if (pcVar3 != pcVar2 + result->_M_string_length) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,"third_party/protobuf-lite/strutil.cc",0x64b);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (out) == (begin + result->size()): ");
    internal::LogFinisher::operator=(&local_69,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  return;
}

Assistant:

void StrAppend(std::string *result, const AlphaNum &a, const AlphaNum &b,
               const AlphaNum &c, const AlphaNum &d) {
  GOOGLE_DCHECK_NO_OVERLAP(*result, a);
  GOOGLE_DCHECK_NO_OVERLAP(*result, b);
  GOOGLE_DCHECK_NO_OVERLAP(*result, c);
  GOOGLE_DCHECK_NO_OVERLAP(*result, d);
  std::string::size_type old_size = result->size();
  result->resize(old_size + a.size() + b.size() + c.size() + d.size());
  char *const begin = &*result->begin();
  char *out = Append4(begin + old_size, a, b, c, d);
  GOOGLE_DCHECK_EQ(out, begin + result->size());
}